

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O2

size_t spdlog::details::os::filesize(FILE *f)

{
  int iVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  stat64 st;
  allocator local_d9;
  string local_d8;
  string local_b8;
  stat64 local_98;
  
  if (f == (FILE *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_b8,"Failed getting file size. fd is null",(allocator *)&local_98);
    throw_spdlog_ex(&local_b8);
  }
  else {
    iVar1 = fileno((FILE *)f);
    iVar1 = fstat64(iVar1,&local_98);
    if (iVar1 == 0) {
      return local_98.st_size;
    }
  }
  std::__cxx11::string::string((string *)&local_d8,"Failed getting file size from fd",&local_d9);
  piVar2 = __errno_location();
  throw_spdlog_ex(&local_d8,*piVar2);
  std::__cxx11::string::~string((string *)&local_d8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

SPDLOG_INLINE size_t filesize(FILE *f)
{
    if (f == nullptr)
    {
        throw_spdlog_ex("Failed getting file size. fd is null");
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
    int fd = ::_fileno(f);
#if _WIN64 // 64 bits
    __int64 ret = ::_filelengthi64(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }

#else // windows 32 bits
    long ret = ::_filelength(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }
#endif

#else // unix
// OpenBSD doesn't compile with :: before the fileno(..)
#if defined(__OpenBSD__)
    int fd = fileno(f);
#else
    int fd = ::fileno(f);
#endif
// 64 bits(but not in osx or cygwin, where fstat64 is deprecated)
#if (defined(__linux__) || defined(__sun) || defined(_AIX)) && (defined(__LP64__) || defined(_LP64))
    struct stat64 st;
    if (::fstat64(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#else // other unix or linux 32 bits or cygwin
    struct stat st;
    if (::fstat(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#endif
#endif
    throw_spdlog_ex("Failed getting file size from fd", errno);
    return 0; // will not be reached.
}